

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWriteFileCommand.cxx
# Opt level: O1

bool cmWriteFileCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  string *fileName;
  bool bVar1;
  int iVar2;
  Status SVar3;
  long *plVar4;
  ostream *poVar5;
  _func_int **pp_Var6;
  _Ios_Openmode _Var7;
  byte bVar8;
  string *psVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  mode_t mode;
  string message;
  string error;
  string dir;
  ofstream file;
  mode_t local_2e4;
  char *local_2e0;
  long local_2d8;
  char local_2d0;
  undefined7 uStack_2cf;
  cmExecutionStatus *local_2c0;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  pointer local_258;
  undefined8 local_250;
  undefined8 local_248;
  char *local_240;
  undefined8 local_238;
  undefined1 local_230 [8];
  long local_228;
  _func_int *local_220;
  long lStack_218;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  fileName = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)fileName) < 0x21) {
    local_230 = (undefined1  [8])&local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,(ulong)(local_220 + 1));
    }
    bVar1 = false;
  }
  else {
    local_2e0 = &local_2d0;
    local_2d8 = 0;
    local_2d0 = '\0';
    psVar9 = fileName + 1;
    if (psVar9 == (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      _Var7 = _S_out;
    }
    else {
      bVar1 = true;
      local_2c0 = status;
      do {
        iVar2 = std::__cxx11::string::compare((char *)psVar9);
        if (iVar2 == 0) {
          bVar1 = false;
        }
        else {
          std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)(psVar9->_M_dataplus)._M_p);
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      status = local_2c0;
      _Var7 = _S_app;
      if (bVar1) {
        _Var7 = _S_out;
      }
    }
    bVar1 = cmMakefile::CanIWriteThisFile(status->Makefile,fileName);
    if (bVar1) {
      cmsys::SystemTools::GetFilenamePath(&local_298,fileName);
      cmsys::SystemTools::MakeDirectory(&local_298,(mode_t *)0x0);
      local_2e4 = 0;
      SVar3 = cmsys::SystemTools::GetPermissions((fileName->_M_dataplus)._M_p,&local_2e4);
      if (SVar3.Kind_ == Success) {
        if ((char)(byte)local_2e4 < '\0') {
          bVar8 = (byte)local_2e4 >> 7;
        }
        else {
          bVar8 = 0;
          cmsys::SystemTools::SetPermissions((fileName->_M_dataplus)._M_p,local_2e4 | 0x90,false);
        }
      }
      else {
        bVar8 = 0;
      }
      std::ofstream::ofstream(local_230,(fileName->_M_dataplus)._M_p,_Var7);
      bVar1 = (abStack_210[(long)*(_func_int **)((long)local_230 + -0x18)] & 5) == 0;
      if (bVar1) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,local_2e0,local_2d8);
        local_278._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_278,1);
        std::ofstream::close();
        if (bVar8 == 0 && local_2e4 != 0) {
          cmsys::SystemTools::SetPermissions((fileName->_M_dataplus)._M_p,local_2e4,false);
        }
      }
      else {
        local_278._M_dataplus._M_p = (pointer)0x2f;
        local_278._M_string_length = 0x85cd62;
        local_278.field_2._M_allocated_capacity = 0;
        local_258 = (fileName->_M_dataplus)._M_p;
        local_278.field_2._8_8_ = fileName->_M_string_length;
        local_250 = 0;
        local_248 = 0xd;
        local_240 = " for writing.";
        local_238 = 0;
        views._M_len = 3;
        views._M_array = (iterator)&local_278;
        cmCatViews(&local_2b8,views);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
      }
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + (long)_VTT[-3]) = _EVP_PKEY_get_bn_param;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::operator+(&local_278,"attempted to write a file: ",fileName);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
      pp_Var6 = (_func_int **)(plVar4 + 2);
      if ((_func_int **)*plVar4 == pp_Var6) {
        local_220 = *pp_Var6;
        lStack_218 = plVar4[3];
        local_230 = (undefined1  [8])&local_220;
      }
      else {
        local_220 = *pp_Var6;
        local_230 = (undefined1  [8])*plVar4;
      }
      local_228 = plVar4[1];
      *plVar4 = (long)pp_Var6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&status->Error);
      cmSystemTools::s_FatalErrorOccurred = true;
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,(ulong)(local_220 + 1));
      }
      bVar1 = false;
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,CONCAT71(uStack_2cf,local_2d0) + 1);
    }
  }
  return bVar1;
}

Assistant:

bool cmWriteFileCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string message;
  auto i = args.begin();

  std::string const& fileName = *i;
  bool overwrite = true;
  i++;

  for (; i != args.end(); ++i) {
    if (*i == "APPEND") {
      overwrite = false;
    } else {
      message += *i;
    }
  }

  if (!status.GetMakefile().CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName.c_str(), mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName.c_str(), newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       overwrite ? std::ios::out : std::ios::app);
  if (!file) {
    std::string error =
      cmStrCat("Internal CMake error when trying to open file: ", fileName,
               " for writing.");
    status.SetError(error);
    return false;
  }
  file << message << '\n';
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName.c_str(), mode);
  }

  return true;
}